

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall
vec<vec<WatchElem>_>::growTo(vec<vec<WatchElem>_> *this,uint size,vec<WatchElem> *pad)

{
  undefined8 *puVar1;
  WatchElem *pWVar2;
  ulong uVar3;
  long lVar4;
  
  if (this->sz < size) {
    reserve(this,size);
    uVar3 = (ulong)this->sz;
    lVar4 = uVar3 << 4;
    for (; uVar3 < size; uVar3 = uVar3 + 1) {
      pWVar2 = pad->data;
      puVar1 = (undefined8 *)((long)&this->data->sz + lVar4);
      *puVar1 = *(undefined8 *)pad;
      puVar1[1] = pWVar2;
      lVar4 = lVar4 + 0x10;
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size, const T& pad) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T(pad);
		}
		sz = size;
	}